

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O3

void __thiscall
TestSchema::readMap<avro::Parser<avro::ReaderImpl<avro::Validator>>>
          (TestSchema *this,Parser<avro::ReaderImpl<avro::Validator>_> *p)

{
  int32_t iVar1;
  int64_t iVar2;
  ostream *poVar3;
  string key;
  char local_61;
  string local_60;
  Validator *local_40;
  int64_t local_38;
  
  local_40 = &(p->reader_).validator_;
  do {
    printNext(this,p);
    avro::Validator::checkTypeExpected(local_40,AVRO_MAP);
    iVar2 = avro::ReaderImpl<avro::Validator>::readCount(&p->reader_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Size ",5);
    poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
    local_60._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_60,1);
    local_38 = iVar2;
    if (0 < iVar2) {
      do {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        local_60._M_string_length = 0;
        local_60.field_2._M_local_buf[0] = '\0';
        printNext(this,p);
        avro::ReaderImpl<avro::Validator>::readValue(&p->reader_,&local_60);
        printNext(this,p);
        iVar1 = avro::Parser<avro::ReaderImpl<avro::Validator>_>::readInt(p);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_60._M_dataplus._M_p,
                            local_60._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        local_61 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_61,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,
                          CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                   local_60.field_2._M_local_buf[0]) + 1);
        }
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
  } while (local_38 != 0);
  return;
}

Assistant:

void readMap(Parser &p)
    {
        int64_t size = 0;
        do { 
            printNext(p);
            size = p.readMapBlockSize();
            std::cout << "Size " << size << '\n';
            for(int64_t i=0; i < size; ++i) {
                std::string key;
                printNext(p);
                p.readString(key);
                printNext(p);
                int32_t intval = p.readInt();
                std::cout << key << ":" << intval << '\n';
            }
        } while (size != 0);
    }